

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

int randomx_blake2b_init_key(blake2b_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  blake2b_param local_e8;
  uint8_t block [128];
  
  if (S != (blake2b_state *)0x0) {
    if ((0xffffffffffffffbf < outlen - 0x41) &&
       (key != (void *)0x0 && 0xffffffffffffffbf < keylen - 0x41)) {
      local_e8.digest_length = (uint8_t)outlen;
      local_e8.key_length = (uint8_t)keylen;
      local_e8.fanout = '\x01';
      local_e8.depth = '\x01';
      local_e8._4_8_ = 0;
      local_e8._12_8_ = 0;
      local_e8.reserved[2] = '\0';
      local_e8.reserved[3] = '\0';
      local_e8.reserved[4] = '\0';
      local_e8.reserved[5] = '\0';
      local_e8.reserved[6] = '\0';
      local_e8.reserved[7] = '\0';
      local_e8.reserved[8] = '\0';
      local_e8.reserved[9] = '\0';
      local_e8.reserved[10] = '\0';
      local_e8.reserved[0xb] = '\0';
      local_e8.reserved[0xc] = '\0';
      local_e8.reserved[0xd] = '\0';
      local_e8.salt[0] = '\0';
      local_e8.salt[1] = '\0';
      local_e8.salt[2] = '\0';
      local_e8.salt[3] = '\0';
      local_e8.salt[4] = '\0';
      local_e8.salt[5] = '\0';
      local_e8.salt[6] = '\0';
      local_e8.salt[7] = '\0';
      local_e8.salt[8] = '\0';
      local_e8.salt[9] = '\0';
      local_e8.salt[10] = '\0';
      local_e8.salt[0xb] = '\0';
      local_e8.salt[0xc] = '\0';
      local_e8.salt[0xd] = '\0';
      local_e8.salt[0xe] = '\0';
      local_e8.salt[0xf] = '\0';
      local_e8.personal[0] = '\0';
      local_e8.personal[1] = '\0';
      local_e8.personal[2] = '\0';
      local_e8.personal[3] = '\0';
      local_e8.personal[4] = '\0';
      local_e8.personal[5] = '\0';
      local_e8.personal[6] = '\0';
      local_e8.personal[7] = '\0';
      local_e8.personal[8] = '\0';
      local_e8.personal[9] = '\0';
      local_e8.personal[10] = '\0';
      local_e8.personal[0xb] = '\0';
      local_e8.personal[0xc] = '\0';
      local_e8.personal[0xd] = '\0';
      local_e8.personal[0xe] = '\0';
      local_e8.personal[0xf] = '\0';
      iVar1 = randomx_blake2b_init_param(S,&local_e8);
      if (-1 < iVar1) {
        block[0x70] = '\0';
        block[0x71] = '\0';
        block[0x72] = '\0';
        block[0x73] = '\0';
        block[0x74] = '\0';
        block[0x75] = '\0';
        block[0x76] = '\0';
        block[0x77] = '\0';
        block[0x78] = '\0';
        block[0x79] = '\0';
        block[0x7a] = '\0';
        block[0x7b] = '\0';
        block[0x7c] = '\0';
        block[0x7d] = '\0';
        block[0x7e] = '\0';
        block[0x7f] = '\0';
        block[0x60] = '\0';
        block[0x61] = '\0';
        block[0x62] = '\0';
        block[99] = '\0';
        block[100] = '\0';
        block[0x65] = '\0';
        block[0x66] = '\0';
        block[0x67] = '\0';
        block[0x68] = '\0';
        block[0x69] = '\0';
        block[0x6a] = '\0';
        block[0x6b] = '\0';
        block[0x6c] = '\0';
        block[0x6d] = '\0';
        block[0x6e] = '\0';
        block[0x6f] = '\0';
        block[0x50] = '\0';
        block[0x51] = '\0';
        block[0x52] = '\0';
        block[0x53] = '\0';
        block[0x54] = '\0';
        block[0x55] = '\0';
        block[0x56] = '\0';
        block[0x57] = '\0';
        block[0x58] = '\0';
        block[0x59] = '\0';
        block[0x5a] = '\0';
        block[0x5b] = '\0';
        block[0x5c] = '\0';
        block[0x5d] = '\0';
        block[0x5e] = '\0';
        block[0x5f] = '\0';
        block[0x40] = '\0';
        block[0x41] = '\0';
        block[0x42] = '\0';
        block[0x43] = '\0';
        block[0x44] = '\0';
        block[0x45] = '\0';
        block[0x46] = '\0';
        block[0x47] = '\0';
        block[0x48] = '\0';
        block[0x49] = '\0';
        block[0x4a] = '\0';
        block[0x4b] = '\0';
        block[0x4c] = '\0';
        block[0x4d] = '\0';
        block[0x4e] = '\0';
        block[0x4f] = '\0';
        block[0x30] = '\0';
        block[0x31] = '\0';
        block[0x32] = '\0';
        block[0x33] = '\0';
        block[0x34] = '\0';
        block[0x35] = '\0';
        block[0x36] = '\0';
        block[0x37] = '\0';
        block[0x38] = '\0';
        block[0x39] = '\0';
        block[0x3a] = '\0';
        block[0x3b] = '\0';
        block[0x3c] = '\0';
        block[0x3d] = '\0';
        block[0x3e] = '\0';
        block[0x3f] = '\0';
        block[0x20] = '\0';
        block[0x21] = '\0';
        block[0x22] = '\0';
        block[0x23] = '\0';
        block[0x24] = '\0';
        block[0x25] = '\0';
        block[0x26] = '\0';
        block[0x27] = '\0';
        block[0x28] = '\0';
        block[0x29] = '\0';
        block[0x2a] = '\0';
        block[0x2b] = '\0';
        block[0x2c] = '\0';
        block[0x2d] = '\0';
        block[0x2e] = '\0';
        block[0x2f] = '\0';
        block[0x10] = '\0';
        block[0x11] = '\0';
        block[0x12] = '\0';
        block[0x13] = '\0';
        block[0x14] = '\0';
        block[0x15] = '\0';
        block[0x16] = '\0';
        block[0x17] = '\0';
        block[0x18] = '\0';
        block[0x19] = '\0';
        block[0x1a] = '\0';
        block[0x1b] = '\0';
        block[0x1c] = '\0';
        block[0x1d] = '\0';
        block[0x1e] = '\0';
        block[0x1f] = '\0';
        block[0] = '\0';
        block[1] = '\0';
        block[2] = '\0';
        block[3] = '\0';
        block[4] = '\0';
        block[5] = '\0';
        block[6] = '\0';
        block[7] = '\0';
        block[8] = '\0';
        block[9] = '\0';
        block[10] = '\0';
        block[0xb] = '\0';
        block[0xc] = '\0';
        block[0xd] = '\0';
        block[0xe] = '\0';
        block[0xf] = '\0';
        memcpy(block,key,keylen);
        randomx_blake2b_update(S,block,0x80);
        return 0;
      }
    }
    if (S->last_node != '\0') {
      S->f[1] = 0xffffffffffffffff;
    }
    S->f[0] = 0xffffffffffffffff;
  }
  return -1;
}

Assistant:

int blake2b_init_key(blake2b_state *S, size_t outlen, const void *key, size_t keylen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	if ((key == 0) || (keylen == 0) || (keylen > BLAKE2B_KEYBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for keyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = (uint8_t)keylen;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	if (blake2b_init_param(S, &P) < 0) {
		blake2b_invalidate_state(S);
		return -1;
	}

	{
		uint8_t block[BLAKE2B_BLOCKBYTES];
		memset(block, 0, BLAKE2B_BLOCKBYTES);
		memcpy(block, key, keylen);
		blake2b_update(S, block, BLAKE2B_BLOCKBYTES);
		/* Burn the key from stack */
		//clear_internal_memory(block, BLAKE2B_BLOCKBYTES);
	}
	return 0;
}